

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O2

FT_Error af_property_get_face_globals(FT_Face face,AF_FaceGlobals *aglobals,AF_Module module)

{
  FT_Error FVar1;
  AF_FaceGlobals globals;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  globals = (AF_FaceGlobals)(face->autohint).data;
  if (globals == (AF_FaceGlobals)0x0) {
    FVar1 = af_face_globals_new(face,&globals,module);
    if (FVar1 != 0) {
      return FVar1;
    }
    (face->autohint).data = globals;
    (face->autohint).finalizer = af_face_globals_free;
  }
  *aglobals = globals;
  return 0;
}

Assistant:

static FT_Error
  af_property_get_face_globals( FT_Face          face,
                                AF_FaceGlobals*  aglobals,
                                AF_Module        module )
  {
    FT_Error        error = FT_Err_Ok;
    AF_FaceGlobals  globals;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    globals = (AF_FaceGlobals)face->autohint.data;
    if ( !globals )
    {
      /* trigger computation of the global style data */
      /* in case it hasn't been done yet              */
      error = af_face_globals_new( face, &globals, module );
      if ( !error )
      {
        face->autohint.data =
          (FT_Pointer)globals;
        face->autohint.finalizer =
          (FT_Generic_Finalizer)af_face_globals_free;
      }
    }

    if ( !error )
      *aglobals = globals;

    return error;
  }